

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

void Diligent::InputLayoutDesc_To_VkVertexInputStateCI
               (InputLayoutDesc *LayoutDesc,VkPipelineVertexInputStateCreateInfo *VertexInputStateCI
               ,VkPipelineVertexInputDivisorStateCreateInfoEXT *VertexInputDivisorCI,
               array<VkVertexInputBindingDescription,_16UL> *BindingDescriptions,
               array<VkVertexInputAttributeDescription,_16UL> *AttributeDescription,
               array<VkVertexInputBindingDivisorDescription,_16UL> *VertexBindingDivisors)

{
  uint32_t uVar1;
  LayoutElement *pLVar2;
  VkVertexInputRate VVar3;
  int iVar4;
  VkVertexInputRate VVar5;
  VkFormat VVar6;
  ulong uVar7;
  VkVertexInputBindingDescription *pVVar8;
  long lVar9;
  uint32_t *puVar10;
  uint uVar11;
  string msg;
  array<int,_16UL> BufferSlot2BindingDescInd;
  
  VertexInputStateCI->sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  VertexInputStateCI->pNext = (void *)0x0;
  VertexInputStateCI->flags = 0;
  VertexInputStateCI->vertexBindingDescriptionCount = 0;
  VertexInputStateCI->pVertexBindingDescriptions = BindingDescriptions->_M_elems;
  VertexInputStateCI->vertexAttributeDescriptionCount = LayoutDesc->NumElements;
  VertexInputStateCI->pVertexAttributeDescriptions = AttributeDescription->_M_elems;
  VertexInputDivisorCI->sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO;
  VertexInputDivisorCI->pNext = (void *)0x0;
  VertexInputDivisorCI->vertexBindingDivisorCount = 0;
  VertexInputDivisorCI->pVertexBindingDivisors = VertexBindingDivisors->_M_elems;
  msg._M_dataplus._M_p._0_4_ = 0xffffffff;
  std::array<int,_16UL>::fill(&BufferSlot2BindingDescInd,(value_type_conflict6 *)&msg);
  puVar10 = &AttributeDescription->_M_elems[0].offset;
  lVar9 = 0x24;
  for (uVar7 = 0; uVar7 < LayoutDesc->NumElements; uVar7 = uVar7 + 1) {
    pLVar2 = LayoutDesc->LayoutElements;
    uVar11 = *(uint *)((long)pLVar2 + lVar9 + -0x18);
    iVar4 = BufferSlot2BindingDescInd._M_elems[uVar11];
    if (iVar4 < 0) {
      uVar1 = VertexInputStateCI->vertexBindingDescriptionCount;
      VertexInputStateCI->vertexBindingDescriptionCount = uVar1 + 1;
      BufferSlot2BindingDescInd._M_elems[uVar11] = uVar1;
      BindingDescriptions->_M_elems[(int)uVar1].binding =
           *(uint32_t *)((long)pLVar2 + lVar9 + -0x18);
      BindingDescriptions->_M_elems[(int)uVar1].stride = *(uint32_t *)((long)pLVar2 + lVar9 + -8);
      VVar3 = LayoutElemFrequencyToVkInputRate
                        (*(INPUT_ELEMENT_FREQUENCY *)((long)pLVar2 + lVar9 + -4));
      BindingDescriptions->_M_elems[(int)uVar1].inputRate = VVar3;
      iVar4 = BufferSlot2BindingDescInd._M_elems[uVar11];
      uVar11 = *(uint *)((long)pLVar2 + lVar9 + -0x18);
    }
    if (BindingDescriptions->_M_elems[iVar4].binding != uVar11) {
      FormatString<char[25]>(&msg,(char (*) [25])"Inconsistent buffer slot");
      DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                 "InputLayoutDesc_To_VkVertexInputStateCI",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x40d);
      std::__cxx11::string::~string((string *)&msg);
    }
    pVVar8 = BindingDescriptions->_M_elems + iVar4;
    if (pVVar8->stride != *(uint32_t *)((long)pLVar2 + lVar9 + -8)) {
      FormatString<char[21]>(&msg,(char (*) [21])"Inconsistent strides");
      DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                 "InputLayoutDesc_To_VkVertexInputStateCI",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x40e);
      std::__cxx11::string::~string((string *)&msg);
    }
    VVar3 = pVVar8->inputRate;
    VVar5 = LayoutElemFrequencyToVkInputRate
                      (*(INPUT_ELEMENT_FREQUENCY *)((long)pLVar2 + lVar9 + -4));
    if (VVar3 != VVar5) {
      FormatString<char[38]>(&msg,(char (*) [38])"Inconsistent layout element frequency");
      DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                 "InputLayoutDesc_To_VkVertexInputStateCI",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x40f);
      std::__cxx11::string::~string((string *)&msg);
    }
    puVar10[-2] = pVVar8->binding;
    ((VkVertexInputAttributeDescription *)(puVar10 + -3))->location =
         *(uint32_t *)((long)pLVar2 + lVar9 + -0x1c);
    VVar6 = TypeToVkFormat(*(VALUE_TYPE *)((long)pLVar2 + lVar9 + -0x10),
                           *(Uint32 *)((long)pLVar2 + lVar9 + -0x14),
                           *(Bool *)((long)pLVar2 + lVar9 + -0xf));
    puVar10[-1] = VVar6;
    *puVar10 = *(uint32_t *)((long)pLVar2 + lVar9 + -0xc);
    if ((*(char *)((long)pLVar2 + lVar9 + -4) == '\x02') &&
       (uVar1 = *(uint32_t *)((long)&pLVar2->HLSLSemantic + lVar9), uVar1 != 1)) {
      uVar11 = VertexInputDivisorCI->vertexBindingDivisorCount;
      VertexInputDivisorCI->vertexBindingDivisorCount = uVar11 + 1;
      VertexBindingDivisors->_M_elems[uVar11].binding = pVVar8->binding;
      VertexBindingDivisors->_M_elems[uVar11].divisor = uVar1;
    }
    lVar9 = lVar9 + 0x28;
    puVar10 = puVar10 + 4;
  }
  return;
}

Assistant:

void InputLayoutDesc_To_VkVertexInputStateCI(const InputLayoutDesc&                                                      LayoutDesc,
                                             VkPipelineVertexInputStateCreateInfo&                                       VertexInputStateCI,
                                             VkPipelineVertexInputDivisorStateCreateInfoEXT&                             VertexInputDivisorCI,
                                             std::array<VkVertexInputBindingDescription, MAX_LAYOUT_ELEMENTS>&           BindingDescriptions,
                                             std::array<VkVertexInputAttributeDescription, MAX_LAYOUT_ELEMENTS>&         AttributeDescription,
                                             std::array<VkVertexInputBindingDivisorDescriptionEXT, MAX_LAYOUT_ELEMENTS>& VertexBindingDivisors)
{
    // Vertex input description
    VertexInputStateCI.sType                           = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
    VertexInputStateCI.pNext                           = nullptr;
    VertexInputStateCI.flags                           = 0; // reserved for future use.
    VertexInputStateCI.vertexBindingDescriptionCount   = 0;
    VertexInputStateCI.pVertexBindingDescriptions      = BindingDescriptions.data();
    VertexInputStateCI.vertexAttributeDescriptionCount = LayoutDesc.NumElements;
    VertexInputStateCI.pVertexAttributeDescriptions    = AttributeDescription.data();

    VertexInputDivisorCI.sType                     = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_EXT;
    VertexInputDivisorCI.pNext                     = nullptr;
    VertexInputDivisorCI.vertexBindingDivisorCount = 0;
    VertexInputDivisorCI.pVertexBindingDivisors    = VertexBindingDivisors.data();

    std::array<Int32, MAX_LAYOUT_ELEMENTS> BufferSlot2BindingDescInd;
    BufferSlot2BindingDescInd.fill(-1);
    for (Uint32 elem = 0; elem < LayoutDesc.NumElements; ++elem)
    {
        const LayoutElement& LayoutElem     = LayoutDesc.LayoutElements[elem];
        Int32&               BindingDescInd = BufferSlot2BindingDescInd[LayoutElem.BufferSlot];
        if (BindingDescInd < 0)
        {
            BindingDescInd = VertexInputStateCI.vertexBindingDescriptionCount++;
            VkVertexInputBindingDescription& BindingDesc{BindingDescriptions[BindingDescInd]};
            BindingDesc.binding   = LayoutElem.BufferSlot;
            BindingDesc.stride    = LayoutElem.Stride;
            BindingDesc.inputRate = LayoutElemFrequencyToVkInputRate(LayoutElem.Frequency);
        }

        const VkVertexInputBindingDescription& BindingDesc = BindingDescriptions[BindingDescInd];
        VERIFY(BindingDesc.binding == LayoutElem.BufferSlot, "Inconsistent buffer slot");
        VERIFY(BindingDesc.stride == LayoutElem.Stride, "Inconsistent strides");
        VERIFY(BindingDesc.inputRate == LayoutElemFrequencyToVkInputRate(LayoutElem.Frequency), "Inconsistent layout element frequency");

        VkVertexInputAttributeDescription& AttribDesc{AttributeDescription[elem]};
        AttribDesc.binding  = BindingDesc.binding;
        AttribDesc.location = LayoutElem.InputIndex;
        AttribDesc.format   = TypeToVkFormat(LayoutElem.ValueType, LayoutElem.NumComponents, LayoutElem.IsNormalized);
        AttribDesc.offset   = LayoutElem.RelativeOffset;

        if (LayoutElem.Frequency == INPUT_ELEMENT_FREQUENCY_PER_INSTANCE && LayoutElem.InstanceDataStepRate != 1)
        {
            VkVertexInputBindingDivisorDescriptionEXT& AttribDivisor{VertexBindingDivisors[VertexInputDivisorCI.vertexBindingDivisorCount++]};
            AttribDivisor.binding = BindingDesc.binding;
            AttribDivisor.divisor = LayoutElem.InstanceDataStepRate;
        }
    }
}